

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sweep.cc
# Opt level: O2

void __thiscall
p2t::Sweep::FillRightAboveEdgeEvent(Sweep *this,SweepContext *tcx,Edge *edge,Node *node)

{
  double dVar1;
  Point *pb;
  Orientation OVar2;
  Node *node_00;
  
  while( true ) {
    node_00 = node;
    node = node_00->next;
    pb = node->point;
    dVar1 = edge->p->x;
    if (dVar1 < pb->x || dVar1 == pb->x) break;
    OVar2 = Orient2d(edge->q,pb,edge->p);
    if (OVar2 == CCW) {
      FillRightBelowEdgeEvent(this,tcx,edge,node_00);
      node = node_00;
    }
  }
  return;
}

Assistant:

void Sweep::FillRightAboveEdgeEvent(SweepContext& tcx, Edge* edge, Node* node)
{
  while (node->next->point->x < edge->p->x) {
    // Check if next node is below the edge
    if (Orient2d(*edge->q, *node->next->point, *edge->p) == CCW) {
      FillRightBelowEdgeEvent(tcx, edge, *node);
    } else {
      node = node->next;
    }
  }
}